

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sexp_conflict
sexp_thread_sleep(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict timeout)

{
  sexp_conflict psVar1;
  int *in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x60ab) = 1;
  if (in_RCX != (int *)&DAT_0000013e) {
    if ((((((ulong)in_RCX & 1) != 1) && ((((ulong)in_RCX & 3) != 0 || (*in_RCX != 0xc)))) &&
        ((((ulong)in_RCX & 3) != 0 || (*in_RCX != 0xb)))) &&
       ((((ulong)in_RCX & 3) != 0 || (*in_RCX != 0xd)))) {
      psVar1 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,3,in_RCX);
      return psVar1;
    }
    *(undefined8 *)(in_RDI + 0x58) = 0x3e;
    sexp_insert_timed(self,(sexp_conflict)n,timeout);
  }
  return (sexp_conflict)0x3e;
}

Assistant:

sexp sexp_thread_sleep (sexp ctx, sexp self, sexp_sint_t n, sexp timeout) {
  sexp_context_waitp(ctx) = 1;
  if (timeout != SEXP_TRUE) {
    sexp_assert_type(ctx, sexp_realp, SEXP_NUMBER, timeout);
    sexp_context_event(ctx) = SEXP_FALSE;
    sexp_insert_timed(ctx, ctx, timeout);
  }
  return SEXP_FALSE;
}